

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::calculateAngleInfo(btGeneric6DofSpring2Constraint *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  RotateOrder RVar8;
  float fVar9;
  btScalar bVar10;
  btScalar bVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  btMatrix3x3 local_38;
  
  fVar21 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
  fVar22 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  fVar14 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  fVar28 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
  fVar25 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar17 = fVar21 * fVar22 - fVar28 * fVar14;
  fVar16 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar27 = fVar14 * fVar25 - fVar22 * fVar16;
  fVar23 = fVar16 * fVar28 - fVar25 * fVar21;
  fVar13 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fVar18 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
  fVar24 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
  fVar29 = 1.0 / (fVar24 * fVar23 + fVar13 * fVar17 + fVar18 * fVar27);
  fVar17 = fVar17 * fVar29;
  fVar9 = (fVar24 * fVar28 - fVar22 * fVar18) * fVar29;
  fVar26 = (fVar18 * fVar14 - fVar21 * fVar24) * fVar29;
  fVar27 = fVar27 * fVar29;
  fVar20 = (fVar13 * fVar22 - fVar25 * fVar24) * fVar29;
  fVar24 = (fVar24 * fVar16 - fVar14 * fVar13) * fVar29;
  fVar23 = fVar23 * fVar29;
  fVar28 = (fVar18 * fVar25 - fVar28 * fVar13) * fVar29;
  fVar29 = (fVar13 * fVar21 - fVar16 * fVar18) * fVar29;
  fVar21 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
  fVar22 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
  fVar14 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
  local_38.m_el[0].m_floats[2] = fVar14 * fVar26 + fVar21 * fVar17 + fVar9 * fVar22;
  local_38.m_el[1].m_floats[2] = fVar14 * fVar24 + fVar21 * fVar27 + fVar20 * fVar22;
  local_38.m_el[2].m_floats[2] = fVar14 * fVar29 + fVar21 * fVar23 + fVar22 * fVar28;
  uVar15 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
  uVar19 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[1].m_floats;
  fVar16 = (float)uVar19;
  fVar13 = (float)((ulong)uVar19 >> 0x20);
  fVar14 = (float)uVar15;
  fVar25 = (float)((ulong)uVar15 >> 0x20);
  uVar15 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[2].m_floats;
  fVar21 = (float)uVar15;
  fVar22 = (float)((ulong)uVar15 >> 0x20);
  local_38.m_el[0].m_floats[1] = fVar26 * fVar22 + fVar17 * fVar25 + fVar9 * fVar13;
  local_38.m_el[0].m_floats[0] = fVar26 * fVar21 + fVar17 * fVar14 + fVar9 * fVar16;
  local_38.m_el[0].m_floats[3] = 0.0;
  local_38.m_el[1].m_floats[1] = fVar24 * fVar22 + fVar27 * fVar25 + fVar20 * fVar13;
  local_38.m_el[1].m_floats[0] = fVar24 * fVar21 + fVar27 * fVar14 + fVar20 * fVar16;
  local_38.m_el[1].m_floats[3] = 0.0;
  local_38.m_el[2].m_floats[1] = fVar29 * fVar22 + fVar23 * fVar25 + fVar28 * fVar13;
  local_38.m_el[2].m_floats[0] = fVar29 * fVar21 + fVar23 * fVar14 + fVar28 * fVar16;
  local_38.m_el[2].m_floats[3] = 0.0;
  RVar8 = this->m_rotateOrder;
  switch(RVar8) {
  case RO_XYZ:
    matrixToEulerXYZ(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_XZY:
    matrixToEulerXZY(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_YXZ:
    matrixToEulerYXZ(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_YZX:
    matrixToEulerYZX(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_ZXY:
    matrixToEulerZXY(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_ZYX:
    matrixToEulerZYX(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  default:
    goto switchD_001933a8_default;
  }
  RVar8 = this->m_rotateOrder;
switchD_001933a8_default:
  switch(RVar8) {
  case RO_XYZ:
    fVar14 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
    fVar28 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
    fVar22 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
    fVar21 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
    fVar25 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    fVar16 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    bVar11 = fVar25 * fVar22 - fVar28 * fVar16;
    fVar13 = fVar14 * fVar16 - fVar21 * fVar22;
    fVar18 = fVar28 * fVar21 - fVar25 * fVar14;
    uVar19 = CONCAT44(fVar18,fVar13);
    *(ulong *)(this->m_calculatedAxis[1].m_floats + 2) = (ulong)(uint)fVar18;
    uVar15 = CONCAT44(fVar21 * fVar18 - fVar16 * bVar11,fVar16 * fVar13 - fVar25 * fVar18);
    bVar12 = fVar25 * bVar11 - fVar21 * fVar13;
    *(ulong *)(this->m_calculatedAxis[0].m_floats + 2) = (ulong)(uint)bVar12;
    fVar21 = fVar28 * fVar18 - fVar22 * fVar13;
    fVar22 = fVar22 * bVar11 - fVar14 * fVar18;
    bVar10 = fVar14 * fVar13 - bVar11 * fVar28;
    *(ulong *)(this->m_calculatedAxis[2].m_floats + 2) = (ulong)(uint)bVar10;
    break;
  case RO_XZY:
    fVar14 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
    fVar28 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
    fVar25 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
    fVar16 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
    fVar13 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    fVar18 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    fVar22 = fVar25 * fVar16 - fVar18 * fVar14;
    fVar24 = fVar22 * fVar25;
    bVar10 = fVar14 * fVar13 - fVar16 * fVar28;
    fVar21 = fVar28 * fVar18 - fVar13 * fVar25;
    *(ulong *)(this->m_calculatedAxis[2].m_floats + 2) = (ulong)(uint)bVar10;
    uVar15 = CONCAT44(fVar18 * fVar21 - bVar10 * fVar16,fVar13 * bVar10 - fVar22 * fVar18);
    bVar12 = fVar16 * fVar22 - fVar21 * fVar13;
    *(ulong *)(this->m_calculatedAxis[0].m_floats + 2) = (ulong)(uint)bVar12;
    goto LAB_001938db;
  case RO_YXZ:
    fVar14 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[1];
    fVar28 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    fVar21 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
    fVar22 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    fVar25 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    fVar16 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
    fVar13 = fVar28 * fVar25 - fVar22 * fVar16;
    fVar18 = fVar16 * fVar21 - fVar25 * fVar14;
    uVar15 = CONCAT44(fVar18,fVar13);
    bVar12 = fVar14 * fVar22 - fVar21 * fVar28;
    *(ulong *)(this->m_calculatedAxis[0].m_floats + 2) = (ulong)(uint)bVar12;
    bVar11 = fVar22 * bVar12 - fVar25 * fVar18;
    fVar22 = fVar21 * fVar18 - fVar22 * fVar13;
    uVar19 = CONCAT44(fVar22,fVar25 * fVar13 - fVar21 * bVar12);
    *(ulong *)(this->m_calculatedAxis[1].m_floats + 2) = (ulong)(uint)fVar22;
    fVar21 = fVar18 * fVar16 - bVar12 * fVar28;
    fVar22 = bVar12 * fVar14 - fVar13 * fVar16;
    bVar10 = fVar28 * fVar13 - fVar18 * fVar14;
    *(ulong *)(this->m_calculatedAxis[2].m_floats + 2) = (ulong)(uint)bVar10;
    break;
  case RO_YZX:
    fVar14 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
    fVar28 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    fVar25 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
    fVar16 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[1];
    fVar13 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    fVar18 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
    fVar22 = fVar25 * fVar16 - fVar18 * fVar14;
    fVar24 = fVar22 * fVar25;
    bVar10 = fVar14 * fVar13 - fVar16 * fVar28;
    fVar21 = fVar28 * fVar18 - fVar13 * fVar25;
    *(ulong *)(this->m_calculatedAxis[2].m_floats + 2) = (ulong)(uint)bVar10;
    fVar9 = fVar13 * bVar10 - fVar22 * fVar18;
    fVar18 = fVar18 * fVar21 - bVar10 * fVar16;
    uVar15 = CONCAT44(fVar18,fVar9);
    bVar12 = fVar16 * fVar22 - fVar21 * fVar13;
    auVar5._4_4_ = fVar18;
    auVar5._0_4_ = fVar9;
    auVar5._8_4_ = bVar12;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar5;
LAB_001938db:
    bVar11 = fVar24 - fVar28 * bVar10;
    fVar28 = fVar21 * fVar28 - fVar14 * fVar22;
    uVar19 = CONCAT44(fVar28,bVar10 * fVar14 - fVar25 * fVar21);
    *(ulong *)(this->m_calculatedAxis[1].m_floats + 2) = (ulong)(uint)fVar28;
    break;
  case RO_ZXY:
    fVar14 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
    fVar28 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    fVar21 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
    fVar22 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
    fVar25 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
    fVar16 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    fVar13 = fVar28 * fVar25 - fVar22 * fVar16;
    fVar18 = fVar16 * fVar21 - fVar25 * fVar14;
    uVar15 = CONCAT44(fVar18,fVar13);
    bVar12 = fVar14 * fVar22 - fVar21 * fVar28;
    auVar7._4_4_ = fVar18;
    auVar7._0_4_ = fVar13;
    auVar7._8_4_ = bVar12;
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar7;
    bVar11 = fVar22 * bVar12 - fVar25 * fVar18;
    fVar25 = fVar25 * fVar13 - fVar21 * bVar12;
    fVar21 = fVar21 * fVar18 - fVar22 * fVar13;
    uVar19 = CONCAT44(fVar21,fVar25);
    auVar2._4_4_ = fVar25;
    auVar2._0_4_ = bVar11;
    auVar2._8_4_ = fVar21;
    auVar2._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[1].m_floats = auVar2;
    fVar21 = fVar18 * fVar16 - bVar12 * fVar28;
    fVar22 = bVar12 * fVar14 - fVar13 * fVar16;
    bVar10 = fVar28 * fVar13 - fVar18 * fVar14;
    goto LAB_00193a08;
  case RO_ZYX:
    fVar14 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
    fVar28 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    fVar22 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
    fVar21 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
    fVar25 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
    fVar16 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
    bVar11 = fVar25 * fVar22 - fVar28 * fVar16;
    fVar18 = fVar14 * fVar16 - fVar21 * fVar22;
    fVar24 = fVar28 * fVar21 - fVar25 * fVar14;
    uVar19 = CONCAT44(fVar24,fVar18);
    auVar4._4_4_ = fVar18;
    auVar4._0_4_ = bVar11;
    auVar4._8_4_ = fVar24;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[1].m_floats = auVar4;
    fVar13 = fVar16 * fVar18 - fVar25 * fVar24;
    fVar16 = fVar21 * fVar24 - fVar16 * bVar11;
    uVar15 = CONCAT44(fVar16,fVar13);
    bVar12 = fVar25 * bVar11 - fVar21 * fVar18;
    auVar6._4_4_ = fVar16;
    auVar6._0_4_ = fVar13;
    auVar6._8_4_ = bVar12;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar6;
    fVar21 = fVar28 * fVar24 - fVar22 * fVar18;
    fVar22 = fVar22 * bVar11 - fVar14 * fVar24;
    bVar10 = fVar14 * fVar18 - bVar11 * fVar28;
LAB_00193a08:
    auVar3._4_4_ = fVar22;
    auVar3._0_4_ = fVar21;
    auVar3._8_4_ = bVar10;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[2].m_floats = auVar3;
    break;
  default:
    uVar15 = *(undefined8 *)this->m_calculatedAxis[0].m_floats;
    bVar12 = this->m_calculatedAxis[0].m_floats[2];
    bVar11 = this->m_calculatedAxis[1].m_floats[0];
    uVar19 = *(undefined8 *)(this->m_calculatedAxis[1].m_floats + 1);
    uVar1 = *(undefined8 *)this->m_calculatedAxis[2].m_floats;
    fVar21 = (float)uVar1;
    fVar22 = (float)((ulong)uVar1 >> 0x20);
    bVar10 = this->m_calculatedAxis[2].m_floats[2];
  }
  fVar14 = (float)uVar15;
  fVar28 = (float)((ulong)uVar15 >> 0x20);
  fVar25 = 1.0 / SQRT(bVar12 * bVar12 + fVar14 * fVar14 + fVar28 * fVar28);
  *(ulong *)this->m_calculatedAxis[0].m_floats = CONCAT44(fVar25 * fVar28,fVar25 * fVar14);
  this->m_calculatedAxis[0].m_floats[2] = bVar12 * fVar25;
  fVar28 = (float)uVar19;
  fVar25 = (float)((ulong)uVar19 >> 0x20);
  fVar14 = 1.0 / SQRT(fVar25 * fVar25 + bVar11 * bVar11 + fVar28 * fVar28);
  this->m_calculatedAxis[1].m_floats[0] = bVar11 * fVar14;
  *(ulong *)(this->m_calculatedAxis[1].m_floats + 1) = CONCAT44(fVar14 * fVar25,fVar14 * fVar28);
  fVar14 = 1.0 / SQRT(bVar10 * bVar10 + fVar21 * fVar21 + fVar22 * fVar22);
  *(ulong *)this->m_calculatedAxis[2].m_floats = CONCAT44(fVar14 * fVar22,fVar14 * fVar21);
  this->m_calculatedAxis[2].m_floats[2] = bVar10 * fVar14;
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	switch (m_rotateOrder)
	{
		case RO_XYZ : matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_XZY : matrixToEulerXZY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YXZ : matrixToEulerYXZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YZX : matrixToEulerYZX(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZXY : matrixToEulerZXY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZYX : matrixToEulerZYX(relative_frame,m_calculatedAxisAngleDiff); break;
		default : btAssert(false);
	}
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	switch (m_rotateOrder)
	{
	case RO_XYZ :
		{
			//Is this the "line of nodes" calculation choosing planes YZ (B coordinate system) and xy (A coordinate system)? (http://en.wikipedia.org/wiki/Euler_angles)
			//The two planes are non-homologous, so this is a Tait�Bryan angle formalism and not a proper Euler
			//Extrinsic rotations are equal to the reversed order intrinsic rotations so the above xyz extrinsic rotations (axes are fixed) are the same as the zy'x" intrinsic rotations (axes are refreshed after each rotation)
			//that is why xy and YZ planes are chosen (this will describe a zy'x" intrinsic rotation) (see the figure on the left at http://en.wikipedia.org/wiki/Euler_angles under Tait�Bryan angles)
			// x' = Nperp = N.cross(axis2)
			// y' = N = axis2.cross(axis0)	
			// z' = z
			//
			// x" = X
			// y" = y'
			// z" = ??
			//in other words:
			//first rotate around z
			//second rotate around y'= z.cross(X)
			//third rotate around x" = X
			//Original XYZ extrinsic rotation order. 
			//Planes: xy and YZ normals: z, X.  Plane intersection (N) is z.cross(X)
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	case RO_XZY :
		{
			//planes: xz,ZY normals: y, X
			//first rotate around y
			//second rotate around z'= y.cross(X)
			//third rotate around x" = X
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_YXZ :
		{
			//planes: yx,XZ normals: z, Y
			//first rotate around z
			//second rotate around x'= z.cross(Y)
			//third rotate around y" = Y
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_YZX :
		{
			//planes: yz,ZX normals: x, Y
			//first rotate around x
			//second rotate around z'= x.cross(Y)
			//third rotate around y" = Y
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_ZXY :
		{
			//planes: zx,XY normals: y, Z
			//first rotate around y
			//second rotate around x'= y.cross(Z)
			//third rotate around z" = Z
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_ZYX :
		{
			//planes: zy,YX normals: x, Z
			//first rotate around x
			//second rotate around y' = x.cross(Z)
			//third rotate around z" = Z
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	default:
		btAssert(false);
	}

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}